

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O3

int compare_list(char **name,void **list,zip_uint64_t *list_length,int element_size,
                _func_int_void_ptr_void_ptr *cmp,_func_int_void_ptr_int_void_ptr *ignore,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_char_void_ptr *print,
                _func_void_void_ptr *start_file)

{
  void **ppvVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  void **ppvVar6;
  void *pvVar7;
  ulong uVar8;
  void *pvVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint *puVar15;
  int *piVar16;
  uint local_6c;
  uint local_48 [2];
  char **local_40;
  ulong local_38;
  
  local_40 = name;
  uVar12 = (ulong)(uint)element_size;
  local_38 = uVar12;
  if (*list_length == 0) {
    uVar13 = 0;
    uVar14 = 0;
    local_6c = 0;
  }
  else {
    ppvVar1 = list + 1;
    uVar10 = 0;
    local_6c = 0;
    uVar14 = 0;
    uVar13 = 0;
    do {
      uVar8 = (ulong)uVar13;
      if (list_length[1] <= uVar8) break;
      iVar4 = (*cmp)(*list,list[1]);
      ppvVar6 = ppvVar1;
      if (iVar4 == 0) {
        if (check != (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0) {
          if (start_file != (_func_void_void_ptr *)0x0) {
            (*start_file)(*list);
          }
          uVar5 = (*check)(local_40,*list,list[1]);
          local_6c = uVar5 | local_6c;
          if (start_file != (_func_void_void_ptr *)0x0) {
            diff_output_end_file(&output);
          }
        }
        *list = (void *)((long)*list + uVar12);
        uVar14 = uVar14 + 1;
        uVar13 = uVar13 + 1;
      }
      else if (iVar4 < 0) {
        if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_00103401:
          (*print)('-',*list);
          minus_count = minus_count + 1;
          local_6c = 1;
        }
        else {
          if (uVar8 < list_length[1]) {
            pvVar7 = *ppvVar1;
          }
          else {
            pvVar7 = (void *)0x0;
          }
          iVar4 = (*ignore)(*list,SUB14(*list_length - 1 <= uVar10,0),pvVar7);
          if (iVar4 == 0) goto LAB_00103401;
        }
        uVar14 = uVar14 + 1;
        ppvVar6 = list;
      }
      else {
        if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_001033c5:
          (*print)('+',*ppvVar1);
          plus_count = plus_count + 1;
          local_6c = 1;
        }
        else {
          if (uVar10 < *list_length) {
            pvVar7 = *list;
          }
          else {
            pvVar7 = (void *)0x0;
          }
          iVar4 = (*ignore)(*ppvVar1,SUB14(list_length[1] - 1 <= uVar8,0),pvVar7);
          if (iVar4 == 0) goto LAB_001033c5;
        }
        uVar13 = uVar13 + 1;
      }
      *ppvVar6 = (void *)((long)*ppvVar6 + uVar12);
      uVar10 = (ulong)uVar14;
    } while (uVar10 < *list_length);
  }
  local_48[0] = uVar14;
  local_48[1] = uVar13;
  puVar15 = local_48;
  bVar3 = true;
  uVar12 = 0;
  do {
    uVar13 = *puVar15;
    uVar8 = (ulong)uVar13;
    uVar10 = list_length[uVar12];
    if (uVar8 < uVar10) {
      uVar11 = uVar12 ^ 1;
      pvVar7 = list[uVar12];
      piVar16 = &plus_count;
      if (bVar3 != false) {
        piVar16 = &minus_count;
      }
      do {
        uVar13 = uVar13 + 1;
        if (ignore == (_func_int_void_ptr_int_void_ptr *)0x0) {
LAB_001034e2:
          (*print)(bVar3 * '\x02' + '+',pvVar7);
          *piVar16 = *piVar16 + 1;
          local_6c = 1;
        }
        else {
          if ((ulong)local_48[uVar11] < list_length[uVar11]) {
            pvVar9 = list[uVar11];
          }
          else {
            pvVar9 = (void *)0x0;
          }
          iVar4 = (*ignore)(pvVar7,SUB14(uVar10 - 1 <= uVar8,0),pvVar9);
          if (iVar4 == 0) {
            pvVar7 = list[uVar12];
            goto LAB_001034e2;
          }
        }
        *puVar15 = uVar13;
        pvVar7 = (void *)((long)list[uVar12] + local_38);
        list[uVar12] = pvVar7;
        uVar8 = (ulong)uVar13;
        uVar10 = list_length[uVar12];
      } while (uVar8 < uVar10);
    }
    uVar12 = 1;
    puVar15 = local_48 + 1;
    bVar2 = !bVar3;
    bVar3 = false;
    if (bVar2) {
      return local_6c;
    }
  } while( true );
}

Assistant:

static int
compare_list(char *const name[2], const void *list[2], const zip_uint64_t list_length[2], int element_size, int (*cmp)(const void *a, const void *b), int (*ignore)(const void *list, int last, const void *other), int (*check)(char *const name[2], const void *a, const void *b), void (*print)(char side, const void *element), void (*start_file)(const void *element)) {
    unsigned int i[2];
    int j;
    int diff;

#define INC(k) (i[k]++, list[k] = ((const char *)list[k]) + element_size)
#define PRINT(k)                                                                                                         \
    do {                                                                                                                 \
        if (ignore && ignore(list[k], i[k] >= list_length[k] - 1, i[1 - k] < list_length[1 - k] ? list[1 - k] : NULL)) { \
            break;                                                                                                       \
        }                                                                                                                \
        print((k) ? '+' : '-', list[k]);                                                                                 \
        (k) ? plus_count++ : minus_count++;                                                                              \
        diff = 1;                                                                                                        \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < list_length[0] && i[1] < list_length[1]) {
        int c = cmp(list[0], list[1]);

        if (c == 0) {
            if (check) {
                if (start_file) {
                    start_file(list[0]);
                }
                diff |= check(name, list[0], list[1]);
                if (start_file) {
                    diff_output_end_file(&output);
                }
            }
            INC(0);
            INC(1);
        }
        else if (c < 0) {
            PRINT(0);
            INC(0);
        }
        else {
            PRINT(1);
            INC(1);
        }
    }

    for (j = 0; j < 2; j++) {
        while (i[j] < list_length[j]) {
            PRINT(j);
            INC(j);
        }
    }

    return diff;
}